

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  bool bVar1;
  Status SVar2;
  unsigned_long uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong dindex;
  Directory dir;
  string fullPath;
  string fullDestPath;
  Directory local_78;
  string local_70;
  string local_50;
  
  Directory::Directory(&local_78);
  SVar2 = Directory::Load(&local_78,source,(string *)0x0);
  if (SVar2.Kind_ == Success) {
    SVar2 = MakeDirectory(destination,(mode_t *)0x0);
    uVar5 = (ulong)SVar2 >> 0x20;
    if (SVar2.Kind_ == Success) {
      dindex = 0;
      while( true ) {
        uVar3 = Directory::GetNumberOfFiles(&local_78);
        if (uVar3 <= dindex) break;
        pcVar4 = Directory::GetFile(&local_78,dindex);
        if ((*pcVar4 != '.') || (pcVar4[1] != '\0')) {
          pcVar4 = Directory::GetFile(&local_78,dindex);
          if ((*pcVar4 != '.') || ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))) {
            std::__cxx11::string::string((string *)&local_70,(string *)source);
            std::__cxx11::string::append((char *)&local_70);
            Directory::GetFile(&local_78,dindex);
            std::__cxx11::string::append((char *)&local_70);
            bVar1 = FileIsDirectory(&local_70);
            if (bVar1) {
              std::__cxx11::string::string((string *)&local_50,(string *)destination);
              std::__cxx11::string::append((char *)&local_50);
              Directory::GetFile(&local_78,dindex);
              std::__cxx11::string::append((char *)&local_50);
              SVar2 = CopyADirectory(&local_70,&local_50,always);
              std::__cxx11::string::~string((string *)&local_50);
            }
            else {
              SVar2 = CopyAFile(&local_70,destination,always);
            }
            uVar5 = (ulong)SVar2 >> 0x20;
            if (SVar2.Kind_ != Success) {
              std::__cxx11::string::~string((string *)&local_70);
              goto LAB_0042d9bd;
            }
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
        dindex = dindex + 1;
      }
      SVar2.Kind_ = Success;
      SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
  }
  else {
    uVar5 = (ulong)SVar2 >> 0x20;
  }
LAB_0042d9bd:
  Directory::~Directory(&local_78);
  return (Status)((ulong)SVar2 & 0xffffffff | uVar5 << 0x20);
}

Assistant:

Status SystemTools::CopyADirectory(std::string const& source,
                                   std::string const& destination, bool always)
{
  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }
  status = SystemTools::MakeDirectory(destination);
  if (!status.IsSuccess()) {
    return status;
  }

  for (size_t fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath)) {
        std::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        status = SystemTools::CopyADirectory(fullPath, fullDestPath, always);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::CopyAFile(fullPath, destination, always);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  return status;
}